

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O0

void Llb_Nonlin4Print(Llb_Mgr_t_conflict *p)

{
  int iVar1;
  Llb_Var_t *pLVar2;
  Llb_Prt_t *pLVar3;
  int local_28;
  uint local_24;
  int k;
  int i;
  Llb_Var_t *pVar;
  Llb_Prt_t *pPart;
  Llb_Mgr_t_conflict *p_local;
  
  printf("\n");
  for (local_24 = 0; (int)local_24 < p->nVars; local_24 = local_24 + 1) {
    pLVar2 = Llb_MgrVar(p,local_24);
    if (pLVar2 != (Llb_Var_t *)0x0) {
      printf("Var %3d : ",(ulong)local_24);
      for (local_28 = 0; iVar1 = Vec_IntSize(pLVar2->vParts), local_28 < iVar1;
          local_28 = local_28 + 1) {
        iVar1 = Vec_IntEntry(pLVar2->vParts,local_28);
        pLVar3 = Llb_MgrPart(p,iVar1);
        printf("%d ",(ulong)(uint)pLVar3->iPart);
      }
      printf("\n");
    }
  }
  for (local_24 = 0; (int)local_24 < p->iPartFree; local_24 = local_24 + 1) {
    pLVar3 = Llb_MgrPart(p,local_24);
    if (pLVar3 != (Llb_Prt_t *)0x0) {
      printf("Part %3d : ",(ulong)local_24);
      for (local_28 = 0; iVar1 = Vec_IntSize(pLVar3->vVars), local_28 < iVar1;
          local_28 = local_28 + 1) {
        iVar1 = Vec_IntEntry(pLVar3->vVars,local_28);
        pLVar2 = Llb_MgrVar(p,iVar1);
        printf("%d ",(ulong)(uint)pLVar2->iVar);
      }
      printf("\n");
    }
  }
  return;
}

Assistant:

void Llb_Nonlin4Print( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i, k;
    printf( "\n" );
    Llb_MgrForEachVar( p, pVar, i )
    {
        printf( "Var %3d : ", i );
        Llb_VarForEachPart( p, pVar, pPart, k )
            printf( "%d ", pPart->iPart );
        printf( "\n" );
    }
    Llb_MgrForEachPart( p, pPart, i )
    {
        printf( "Part %3d : ", i );
        Llb_PartForEachVar( p, pPart, pVar, k )
            printf( "%d ", pVar->iVar );
        printf( "\n" );
    }
}